

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::register_read(Compiler *this,uint32_t expr,uint32_t chain,bool forwarded)

{
  uint32_t *puVar1;
  uint32_t id;
  bool bVar2;
  SPIRExpression *pSVar3;
  SPIRVariable *pSVar4;
  
  pSVar3 = get<spirv_cross::SPIRExpression>(this,expr);
  pSVar4 = maybe_get_backing_variable(this,chain);
  if (pSVar4 != (SPIRVariable *)0x0) {
    id = (pSVar4->super_IVariant).self.id;
    (pSVar3->loaded_from).id = id;
    if (forwarded) {
      bVar2 = is_immutable(this,id);
      if (!bVar2) {
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                  (&pSVar4->dependees,&(pSVar3->super_IVariant).self);
      }
    }
    if (pSVar4->parameter != (Parameter *)0x0) {
      puVar1 = &pSVar4->parameter->read_count;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void Compiler::register_read(uint32_t expr, uint32_t chain, bool forwarded)
{
	auto &e = get<SPIRExpression>(expr);
	auto *var = maybe_get_backing_variable(chain);

	if (var)
	{
		e.loaded_from = var->self;

		// If the backing variable is immutable, we do not need to depend on the variable.
		if (forwarded && !is_immutable(var->self))
			var->dependees.push_back(e.self);

		// If we load from a parameter, make sure we create "inout" if we also write to the parameter.
		// The default is "in" however, so we never invalidate our compilation by reading.
		if (var && var->parameter)
			var->parameter->read_count++;
	}
}